

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GetSuffledPicturePaths.h
# Opt level: O3

bool GetShuffledPicturePaths::isImageFile(string *str)

{
  int iVar1;
  long lVar2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *supportedExtension;
  pointer pbVar4;
  long *plVar5;
  bool bVar6;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string imagePath;
  allocator_type local_99;
  pointer local_98;
  string local_90;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  toLowerCase(&local_50,str);
  if ((isImageFile(std::__cxx11::string_const&)::supportedImageExtensions_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&isImageFile(std::__cxx11::string_const&)::
                                   supportedImageExtensions_abi_cxx11_), iVar1 != 0)) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,".jpg","");
    plVar5 = local_60;
    local_70[0] = plVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,".png","");
    __l._M_len = 2;
    __l._M_array = &local_90;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&isImageFile(std::__cxx11::string_const&)::supportedImageExtensions_abi_cxx11_,__l,
             &local_99);
    lVar2 = -0x40;
    do {
      if (plVar5 != (long *)plVar5[-2]) {
        operator_delete((long *)plVar5[-2],*plVar5 + 1);
      }
      plVar5 = plVar5 + -4;
      lVar2 = lVar2 + 0x20;
    } while (lVar2 != 0);
    __cxa_atexit(std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::~vector,
                 &isImageFile(std::__cxx11::string_const&)::supportedImageExtensions_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&isImageFile(std::__cxx11::string_const&)::
                         supportedImageExtensions_abi_cxx11_);
  }
  local_98 = isImageFile(std::__cxx11::string_const&)::supportedImageExtensions_abi_cxx11_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (isImageFile(std::__cxx11::string_const&)::supportedImageExtensions_abi_cxx11_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      isImageFile(std::__cxx11::string_const&)::supportedImageExtensions_abi_cxx11_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar6 = false;
  }
  else {
    pbVar4 = isImageFile(std::__cxx11::string_const&)::supportedImageExtensions_abi_cxx11_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      toLowerCase(&local_90,str);
      lVar2 = std::__cxx11::string::find((char *)&local_90,(ulong)(pbVar4->_M_dataplus)._M_p,0);
      lVar3 = str->_M_string_length - pbVar4->_M_string_length;
      bVar6 = lVar2 == lVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    } while ((lVar2 != lVar3) && (pbVar4 = pbVar4 + 1, pbVar4 != local_98));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return bVar6;
}

Assistant:

bool isImageFile(const std::string& str)
    {
        std::string imagePath = toLowerCase(str);

        static const std::vector<std::string> supportedImageExtensions = {".jpg", ".png"};
        for(const auto& supportedExtension : supportedImageExtensions) {
            if (toLowerCase(str).find(supportedExtension) == str.size() - supportedExtension.size()){
                return true;
            }
        }
        return false;
    }